

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

TPM_HANDLE
TSS_CreatePersistentKey
          (TSS_DEVICE *tpm_device,TPM_HANDLE request_handle,TSS_SESSION *sess,
          TPMI_DH_OBJECT hierarchy,TPM2B_PUBLIC *inPub,TPM2B_PUBLIC *outPub)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  TPM2B_NAME qName;
  TPM2B_NAME name;
  TPM_RC tpm_result;
  TPM_HANDLE result;
  TPM2B_PUBLIC *outPub_local;
  TPM2B_PUBLIC *inPub_local;
  TSS_SESSION *pTStack_20;
  TPMI_DH_OBJECT hierarchy_local;
  TSS_SESSION *sess_local;
  TSS_DEVICE *pTStack_10;
  TPM_HANDLE request_handle_local;
  TSS_DEVICE *tpm_device_local;
  
  _tpm_result = outPub;
  outPub_local = inPub;
  inPub_local._4_4_ = hierarchy;
  pTStack_20 = sess;
  sess_local._4_4_ = request_handle;
  pTStack_10 = tpm_device;
  name._62_4_ = TPM2_ReadPublic(tpm_device,request_handle,outPub,(TPM2B_NAME *)(qName.t.name + 0x3c)
                                ,(TPM2B_NAME *)((long)&l + 4));
  if (name._62_4_ == 0) {
    name._66_4_ = sess_local._4_4_;
  }
  else if (name._62_4_ == 0x8b) {
    name._62_4_ = TSS_CreatePrimary(pTStack_10,pTStack_20,inPub_local._4_4_,outPub_local,
                                    (TPM_HANDLE *)(name.t.name + 0x40),_tpm_result);
    if (name._62_4_ == 0) {
      name._62_4_ = TPM2_EvictControl(pTStack_10,pTStack_20,0x40000001,name._66_4_,sess_local._4_4_)
      ;
      if (name._62_4_ == 0) {
        name._62_4_ = TPM2_FlushContext(pTStack_10,name._66_4_);
        if (name._62_4_ == 0) {
          name._66_4_ = sess_local._4_4_;
        }
        else {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                      ,"TSS_CreatePersistentKey",0xea,1,"Failed calling TPM2_FlushContext 0x%x",
                      name._62_4_);
          }
          name._66_4_ = 0;
        }
      }
      else {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                    ,"TSS_CreatePersistentKey",0xe5,1,"Failed calling TPM2_EvictControl 0x%x",
                    name._62_4_);
        }
        name._66_4_ = 0;
      }
    }
    else {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                  ,"TSS_CreatePersistentKey",0xde,1,"Failed calling TSS_CreatePrimary 0x%x",
                  name._62_4_);
      }
      name._66_4_ = 0;
    }
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                ,"TSS_CreatePersistentKey",0xd7,1,"Failed calling TPM2_ReadPublic 0x%x",name._62_4_)
      ;
    }
    name._66_4_ = 0;
  }
  return name._66_4_;
}

Assistant:

TPM_HANDLE TSS_CreatePersistentKey(TSS_DEVICE* tpm_device, TPM_HANDLE request_handle, TSS_SESSION* sess, TPMI_DH_OBJECT hierarchy, TPM2B_PUBLIC* inPub, TPM2B_PUBLIC* outPub)
{
    TPM_HANDLE result;
    TPM_RC tpm_result;
    TPM2B_NAME name;
    TPM2B_NAME qName;

    tpm_result = TPM2_ReadPublic(tpm_device, request_handle, outPub, &name, &qName);
    if (tpm_result == TPM_RC_SUCCESS)
    {
        result = request_handle;
    }
    else if (tpm_result != TPM_RC_HANDLE)
    {
        LogError("Failed calling TPM2_ReadPublic 0x%x", tpm_result);
        result = 0;
    }
    else
    {
        if ((tpm_result = TSS_CreatePrimary(tpm_device, sess, hierarchy, inPub, &result, outPub)) != TPM_RC_SUCCESS)
        {
            LogError("Failed calling TSS_CreatePrimary 0x%x", tpm_result);
            result = 0;
        }
        else
        {
            if ((tpm_result = TPM2_EvictControl(tpm_device, sess, TPM_RH_OWNER, result, request_handle)) != TPM_RC_SUCCESS)
            {
                LogError("Failed calling TPM2_EvictControl 0x%x", tpm_result);
                result = 0;
            }
            else if ((tpm_result = TPM2_FlushContext(tpm_device, result)) != TPM_RC_SUCCESS)
            {
                LogError("Failed calling TPM2_FlushContext 0x%x", tpm_result);
                result = 0;
            }
            else
            {
                result = request_handle;
            }
        }
    }
    return result;
}